

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ApiInstCount(Fts5Context *pCtx,int *pnInst)

{
  int iVar1;
  
  if ((((byte)pCtx[0x50] & 8) != 0) && (iVar1 = fts5CacheInstArray((Fts5Cursor *)pCtx), iVar1 != 0))
  {
    return iVar1;
  }
  *pnInst = *(int *)(pCtx + 0xac);
  return 0;
}

Assistant:

static int fts5ApiInstCount(Fts5Context *pCtx, int *pnInst){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  int rc = SQLITE_OK;
  if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_INST)==0
   || SQLITE_OK==(rc = fts5CacheInstArray(pCsr)) ){
    *pnInst = pCsr->nInstCount;
  }
  return rc;
}